

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.h
# Opt level: O0

void __thiscall embree::Token::Token(Token *this,string *str,Type ty,ParseLocation *loc)

{
  ParseLocation *in_RCX;
  undefined4 in_EDX;
  string *in_RSI;
  ParseLocation *in_RDI;
  
  *(undefined4 *)
   &(in_RDI->fileName).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = in_EDX;
  std::__cxx11::string::string
            ((string *)
             &(in_RDI->fileName).
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,in_RSI);
  ParseLocation::ParseLocation(in_RCX,in_RDI);
  return;
}

Assistant:

Token (std::string str, Type ty, const ParseLocation& loc = ParseLocation()) : ty(ty),   str(str), loc(loc) {}